

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,Kind k)

{
  bool bVar1;
  Kind KVar2;
  reference this_00;
  non_const_type puVar3;
  undefined8 uVar4;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar5;
  ostream *poVar6;
  char *pcVar7;
  Exception *this_01;
  Kind in_ESI;
  Decoder *in_stack_00000038;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000040;
  ostringstream oss;
  size_t n;
  Kind result;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *p_1;
  RepeaterInfo *p;
  ProductionPtr pp_1;
  ProductionPtr pp;
  Symbol *s;
  string *in_stack_fffffffffffffd48;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_fffffffffffffd50;
  ProductionPtr *in_stack_fffffffffffffd68;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_fffffffffffffd70;
  Symbol *in_stack_fffffffffffffd80;
  ResolvingDecoderHandler *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_fffffffffffffdc0;
  ostringstream local_220 [336];
  Kind in_stack_ffffffffffffff30;
  Kind in_stack_ffffffffffffff34;
  
  do {
    while( true ) {
      this_00 = std::
                stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                       *)0x215a51);
      KVar2 = Symbol::kind(this_00);
      if (KVar2 == in_ESI) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x215a7d);
        return in_ESI;
      }
      bVar1 = Symbol::isTerminal(this_00);
      if (!bVar1) break;
      Symbol::kind(this_00);
      throwMismatch(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    }
    KVar2 = Symbol::kind(this_00);
    switch(KVar2) {
    case sRoot:
      Symbol::
      extrap<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x215b0d);
      boost::tuples::
      get<0,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>
                ((cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>
                  *)0x215b15);
      append(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      break;
    case sRepeater:
      Symbol::
      extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x215c60);
      puVar3 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x215c75);
      *puVar3 = *puVar3 - 1;
      boost::tuples::
      get<2,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                  *)0x215c8c);
      append(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      break;
    default:
      bVar1 = Symbol::isImplicitAction(this_00);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_220);
        poVar6 = std::operator<<((ostream *)local_220,"Encountered ");
        KVar2 = Symbol::kind(this_00);
        pcVar7 = Symbol::toString(KVar2);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6," while looking for ");
        pcVar7 = Symbol::toString(in_ESI);
        std::operator<<(poVar6,pcVar7);
        this_01 = (Exception *)__cxa_allocate_exception(0x18);
        std::__cxx11::ostringstream::str();
        Exception::Exception(this_01,in_stack_fffffffffffffd48);
        __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
      }
      ResolvingDecoderHandler::handle(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      KVar2 = Symbol::kind(this_00);
      if (KVar2 == sWriterUnion) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x215e26);
        selectBranch(in_stack_fffffffffffffdc0,
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      }
      else {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x215e48);
      }
      break;
    case sIndirect:
      Symbol::
      extra<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd48);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x215b4f);
      append(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x215b6d);
      break;
    case sSymbolic:
      Symbol::
      extra<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd48);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                (in_stack_fffffffffffffd50,
                 (weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                  *)in_stack_fffffffffffffd48);
      boost::weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
      ~weak_ptr((weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x215bd3);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x215be1);
      append(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x215c02);
      break;
    case sSkipStart:
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x215dc3);
      skip(in_stack_00000040,in_stack_00000038);
      break;
    case sResolve:
      ppVar5 = Symbol::extrap<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         ((Symbol *)0x215d64);
      assertMatch(sTerminalLow,0x215d83);
      KVar2 = ppVar5->first;
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x215da2);
      return KVar2;
    case sError:
      uVar4 = __cxa_allocate_exception(0x18);
      Symbol::extra<std::__cxx11::string>((Symbol *)in_stack_fffffffffffffd48);
      Exception::Exception((Exception *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }